

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkTiming.c
# Opt level: O3

void Nwk_NodeUpdateRequired(Nwk_Obj_t *pObj)

{
  Tim_Man_t *p;
  Vec_Ptr_t *vQueue;
  Nwk_Obj_t *pObj_00;
  Vec_Ptr_t *pVVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  Nwk_Obj_t *pObj_01;
  float fVar10;
  
  if ((*(uint *)&pObj->field_0x20 & 7) != 3) {
    __assert_fail("Nwk_ObjIsNode(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/nwk/nwkTiming.c"
                  ,0x289,"void Nwk_NodeUpdateRequired(Nwk_Obj_t *)");
  }
  p = pObj->pMan->pManTime;
  vQueue = pObj->pMan->vTemp;
  fVar10 = Nwk_NodeComputeRequired(pObj,1);
  if ((fVar10 + 0.01 <= pObj->tRequired) || (pObj->tRequired + 0.01 <= fVar10)) {
    __assert_fail("Nwk_ManTimeEqual( tRequired, Nwk_ObjRequired(pObj), (float)0.01 )",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/nwk/nwkTiming.c"
                  ,0x28c,"void Nwk_NodeUpdateRequired(Nwk_Obj_t *)");
  }
  vQueue->nSize = 0;
  iVar2 = pObj->nFanins;
  if (iVar2 < 1) {
LAB_008ecec7:
    pObj_01 = (Nwk_Obj_t *)0x0;
  }
  else {
    lVar6 = 0;
    do {
      pObj_01 = pObj->pFanio[lVar6];
      if (pObj_01 == (Nwk_Obj_t *)0x0) goto LAB_008ecec7;
      if ((pObj_01->field_0x20 & 0x10) == 0) {
        Nwk_NodeUpdateAddToQueue(vQueue,pObj_01,-1,0);
        pObj_01->field_0x20 = pObj_01->field_0x20 | 0x10;
        iVar2 = pObj->nFanins;
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < iVar2);
  }
  if (p != (Tim_Man_t *)0x0) {
    Tim_ManIncrementTravId(p);
  }
  if (0 < vQueue->nSize) {
    lVar6 = 0;
    do {
      pObj_00 = (Nwk_Obj_t *)vQueue->pArray[lVar6];
      *(uint *)&pObj_00->field_0x20 = *(uint *)&pObj_00->field_0x20 & 0xffffffef;
      fVar10 = Nwk_NodeComputeRequired(pObj_00,1);
      if ((p != (Tim_Man_t *)0x0) && ((*(uint *)&pObj_00->field_0x20 & 7) == 2)) {
        fVar10 = Tim_ManGetCoRequired(p,*(uint *)&pObj_00->field_0x20 >> 7);
      }
      if ((fVar10 + 0.01 <= pObj_00->tRequired) || (pObj_00->tRequired + 0.01 <= fVar10)) {
        pObj_00->tRequired = fVar10;
        if ((*(uint *)&pObj_00->field_0x20 & 7) == 1) {
          if ((p != (Tim_Man_t *)0x0) &&
             (iVar2 = Tim_ManBoxForCi(p,*(uint *)&pObj_00->field_0x20 >> 7), -1 < iVar2)) {
            iVar3 = Tim_ManIsCiTravIdCurrent(p,*(uint *)&pObj_00->field_0x20 >> 7);
            if (iVar3 != 0) {
              Tim_ManSetPreviousTravIdBoxOutputs(p,iVar2);
            }
            Tim_ManSetCiRequired(p,*(uint *)&pObj_00->field_0x20 >> 7,fVar10);
            Tim_ManSetCurrentTravIdBoxOutputs(p,iVar2);
            uVar4 = Tim_ManBoxInputFirst(p,iVar2);
            uVar5 = Tim_ManBoxInputNum(p,iVar2);
            if (0 < (int)uVar5) {
              uVar7 = (ulong)uVar4;
              uVar9 = (ulong)uVar5;
              do {
                if (((int)uVar4 < 0) || (pVVar1 = pObj_01->pMan->vCos, pVVar1->nSize <= (int)uVar7))
                {
                  __assert_fail("i >= 0 && i < p->nSize",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
                }
                pObj_01 = (Nwk_Obj_t *)pVVar1->pArray[uVar7];
                if ((pObj_01->field_0x20 & 0x10) == 0) {
                  Nwk_NodeUpdateAddToQueue(vQueue,pObj_01,(int)lVar6,0);
                  pObj_01->field_0x20 = pObj_01->field_0x20 | 0x10;
                }
                uVar7 = uVar7 + 1;
                uVar9 = uVar9 - 1;
              } while (uVar9 != 0);
            }
          }
        }
        else {
          iVar2 = pObj_00->nFanins;
          if (0 < iVar2) {
            lVar8 = 0;
            do {
              pObj_01 = pObj_00->pFanio[lVar8];
              if (pObj_01 == (Nwk_Obj_t *)0x0) {
                pObj_01 = (Nwk_Obj_t *)0x0;
                break;
              }
              if ((pObj_01->field_0x20 & 0x10) == 0) {
                Nwk_NodeUpdateAddToQueue(vQueue,pObj_01,(int)lVar6,0);
                pObj_01->field_0x20 = pObj_01->field_0x20 | 0x10;
                iVar2 = pObj_00->nFanins;
              }
              lVar8 = lVar8 + 1;
            } while (lVar8 < iVar2);
          }
        }
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < vQueue->nSize);
  }
  return;
}

Assistant:

void Nwk_NodeUpdateRequired( Nwk_Obj_t * pObj )
{
    Tim_Man_t * pManTime = pObj->pMan->pManTime;
    Vec_Ptr_t * vQueue = pObj->pMan->vTemp;
    Nwk_Obj_t * pTemp;
    Nwk_Obj_t * pNext = NULL; // Suppress "might be used uninitialized"
    float tRequired;
    int iCur, k, iBox, iTerm1, nTerms;
    assert( Nwk_ObjIsNode(pObj) );
    // make sure the node's required time remained the same
    tRequired = Nwk_NodeComputeRequired( pObj, 1 );
    assert( Nwk_ManTimeEqual( tRequired, Nwk_ObjRequired(pObj), (float)0.01 ) );
    // initialize the queue with the node's faninsa and the old node's fanins
    Vec_PtrClear( vQueue );
    Nwk_ObjForEachFanin( pObj, pNext, k )
    {
        if ( pNext->MarkA )
            continue;
        Nwk_NodeUpdateAddToQueue( vQueue, pNext, -1, 0 );
        pNext->MarkA = 1;
    }
    // process objects
    if ( pManTime )
        Tim_ManIncrementTravId( pManTime );
    Vec_PtrForEachEntry( Nwk_Obj_t *, vQueue, pTemp, iCur )
    {
        pTemp->MarkA = 0;
        tRequired = Nwk_NodeComputeRequired( pTemp, 1 );
        if ( Nwk_ObjIsCo(pTemp) && pManTime )
            tRequired = Tim_ManGetCoRequired( pManTime, pTemp->PioId );
        if ( Nwk_ManTimeEqual( tRequired, Nwk_ObjRequired(pTemp), (float)0.01 ) )
            continue;
        Nwk_ObjSetRequired( pTemp, tRequired );
        // add the fanins to the queue
        if ( Nwk_ObjIsCi(pTemp) )
        {
            if ( pManTime )
            {
                iBox = Tim_ManBoxForCi( pManTime, pTemp->PioId );
                if ( iBox >= 0 ) // this CI is an output of the box
                {
                    // it may happen that a box-output (CI) was already marked as visited
                    // when some other box-output of the same box was visited - here we undo this
                    if ( Tim_ManIsCiTravIdCurrent( pManTime, pTemp->PioId ) )
                        Tim_ManSetPreviousTravIdBoxOutputs( pManTime, iBox );
                    Tim_ManSetCiRequired( pManTime, pTemp->PioId, tRequired );
                    Tim_ManSetCurrentTravIdBoxOutputs( pManTime, iBox );
                    iTerm1 = Tim_ManBoxInputFirst( pManTime, iBox );
                    nTerms = Tim_ManBoxInputNum( pManTime, iBox );
                    for ( k = 0; k < nTerms; k++ )
                    {
                        pNext = Nwk_ManCo(pNext->pMan, iTerm1 + k);
                        if ( pNext->MarkA )
                            continue;
                        Nwk_NodeUpdateAddToQueue( vQueue, pNext, iCur, 0 );
                        pNext->MarkA = 1;
                    }
                }
            }
        }
        else
        {
            Nwk_ObjForEachFanin( pTemp, pNext, k )
            {
                if ( pNext->MarkA )
                    continue;
                Nwk_NodeUpdateAddToQueue( vQueue, pNext, iCur, 0 );
                pNext->MarkA = 1;
            }
        }
    }
}